

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O3

String * Jinx::Impl::ConvertUtf16ToUtf8(String *__return_storage_ptr__,StringU16 *utf16_string)

{
  pointer pcVar1;
  size_type __res;
  size_t sVar2;
  char16_t *utf16In;
  char32_t utf32CodePoint;
  char outBuffer [5];
  size_t numOut;
  char32_t local_4c;
  char local_45 [5];
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *local_38;
  
  pcVar1 = (utf16_string->_M_dataplus)._M_p;
  __res = utf16_string->_M_string_length;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  local_4c = L'\0';
  local_40 = 0;
  utf16In = pcVar1;
  while (*utf16In != L'\0') {
    ConvertUtf16ToUtf32(utf16In,(uint32_t)((long)pcVar1 + (__res * 2 - (long)utf16In) >> 1),
                        &local_4c,&local_40);
    sVar2 = local_40;
    ConvertUtf32ToUtf8(local_4c,local_45,5,&local_40);
    utf16In = utf16In + sVar2;
    local_45[local_40] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (__return_storage_ptr__,local_45);
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String ConvertUtf16ToUtf8(const StringU16 & utf16_string)
	{
		const char16_t * cInStr = utf16_string.c_str();
		const char16_t * cInStrEnd = cInStr + utf16_string.size();
		String outString;
		outString.reserve(utf16_string.size());
		char outBuffer[5];
		char32_t utf32CodePoint = 0;
		size_t numOut = 0;
		while (*cInStr != 0)
		{
			Impl::ConvertUtf16ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
			cInStr += numOut;
			Impl::ConvertUtf32ToUtf8(utf32CodePoint, outBuffer, std::size(outBuffer), &numOut);
			outBuffer[numOut] = 0;
			outString += outBuffer;
		}
		return outString;
	}